

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_SFVFS(TT_ExecContext exc,FT_Long *args)

{
  FT_Long Y;
  FT_Long X;
  FT_Short S;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  Normalize((long)(short)*args,(long)(short)args[1],&(exc->GS).freeVector);
  Compute_Funcs(exc);
  return;
}

Assistant:

static void
  Ins_SFVFS( TT_ExecContext  exc,
             FT_Long*        args )
  {
    FT_Short  S;
    FT_Long   X, Y;


    /* Only use low 16bits, then sign extend */
    S = (FT_Short)args[1];
    Y = (FT_Long)S;
    S = (FT_Short)args[0];
    X = S;

    Normalize( X, Y, &exc->GS.freeVector );
    Compute_Funcs( exc );
  }